

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall google::protobuf::DescriptorPool::Tables::RollbackToLastCheckpoint(Tables *this)

{
  size_type *psVar1;
  pointer *ppCVar2;
  char *__s1;
  _Node *p_Var3;
  pointer ppMVar4;
  pointer ppvVar5;
  pointer pCVar6;
  int iVar7;
  LogMessage *other;
  ulong uVar8;
  char cVar9;
  char *pcVar10;
  _Node *p_Var11;
  pointer ppcVar12;
  pointer ppVar13;
  _Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
  **pp_Var14;
  long lVar15;
  _Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
  **pp_Var16;
  _Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
  **pp_Var17;
  _Node *__p;
  _Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
  *p_Var18;
  pointer ppMVar19;
  ulong uVar20;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::_Rb_tree_iterator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
  pVar21;
  LogFinisher local_71;
  pointer local_70;
  LogMessage local_68;
  
  if ((this->checkpoints_).
      super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->checkpoints_).
      super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
               ,0x250);
    other = internal::LogMessage::operator<<(&local_68,"CHECK failed: !checkpoints_.empty(): ");
    internal::LogFinisher::operator=(&local_71,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  local_70 = (this->checkpoints_).
             super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ppcVar12 = (this->symbols_after_checkpoint_).
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  uVar20 = (ulong)local_70[-1].pending_symbols_before_checkpoint;
  do {
    if ((ulong)((long)(this->symbols_after_checkpoint_).
                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppcVar12 >> 3) <= uVar20) {
      uVar20 = (ulong)local_70[-1].pending_files_before_checkpoint;
      ppcVar12 = (this->files_after_checkpoint_).
                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (uVar20 < (ulong)((long)(this->files_after_checkpoint_).
                                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar12 >> 3)) {
        lVar15 = uVar20 * 8;
        do {
          std::tr1::
          _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
          ::erase((_Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                   *)&this->files_by_name_,(key_type *)((long)ppcVar12 + lVar15));
          uVar20 = uVar20 + 1;
          ppcVar12 = (this->files_after_checkpoint_).
                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          lVar15 = lVar15 + 8;
        } while (uVar20 < (ulong)((long)(this->files_after_checkpoint_).
                                        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar12
                                 >> 3));
      }
      uVar20 = (ulong)local_70[-1].pending_extensions_before_checkpoint;
      ppVar13 = (this->extensions_after_checkpoint_).
                super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (uVar20 < (ulong)((long)(this->extensions_after_checkpoint_).
                                 super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar13 >> 4)) {
        lVar15 = uVar20 << 4;
        do {
          pVar21 = std::
                   _Rb_tree<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
                   ::equal_range(&(this->extensions_)._M_t,
                                 (key_type *)((long)&ppVar13->first + lVar15));
          std::
          _Rb_tree<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
          ::_M_erase_aux(&(this->extensions_)._M_t,(_Base_ptr)pVar21.first._M_node,
                         (_Base_ptr)pVar21.second._M_node);
          uVar20 = uVar20 + 1;
          ppVar13 = (this->extensions_after_checkpoint_).
                    super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar15 = lVar15 + 0x10;
        } while (uVar20 < (ulong)((long)(this->extensions_after_checkpoint_).
                                        super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar13
                                 >> 4));
      }
      pCVar6 = local_70;
      std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
                (&this->symbols_after_checkpoint_,
                 (long)local_70[-1].pending_symbols_before_checkpoint);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
                (&this->files_after_checkpoint_,(long)pCVar6[-1].pending_files_before_checkpoint);
      std::
      vector<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
      ::resize(&this->extensions_after_checkpoint_,
               (long)pCVar6[-1].pending_extensions_before_checkpoint);
      STLDeleteContainerPointers<__gnu_cxx::__normal_iterator<std::__cxx11::string**,std::vector<std::__cxx11::string*,std::allocator<std::__cxx11::string*>>>>
                ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_**,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                  )((this->strings_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start + pCVar6[-1].strings_before_checkpoint
                   ),(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_**,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                      )(this->strings_).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
      ppMVar4 = (this->messages_).
                super__Vector_base<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppMVar19 = (this->messages_).
                      super__Vector_base<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>
                      ._M_impl.super__Vector_impl_data._M_start +
                      pCVar6[-1].messages_before_checkpoint; pCVar6 = local_70, ppMVar19 != ppMVar4;
          ppMVar19 = ppMVar19 + 1) {
        if (*ppMVar19 != (Message *)0x0) {
          (*((*ppMVar19)->super_MessageLite)._vptr_MessageLite[1])();
        }
      }
      STLDeleteContainerPointers<__gnu_cxx::__normal_iterator<google::protobuf::FileDescriptorTables**,std::vector<google::protobuf::FileDescriptorTables*,std::allocator<google::protobuf::FileDescriptorTables*>>>>
                ((__normal_iterator<google::protobuf::FileDescriptorTables_**,_std::vector<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>_>
                  )((this->file_tables_).
                    super__Vector_base<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                   local_70[-1].file_tables_before_checkpoint),
                 (__normal_iterator<google::protobuf::FileDescriptorTables_**,_std::vector<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>_>
                  )(this->file_tables_).
                   super__Vector_base<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      for (uVar20 = (ulong)pCVar6[-1].allocations_before_checkpoint; pCVar6 = local_70,
          ppvVar5 = (this->allocations_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
          uVar20 < (ulong)((long)(this->allocations_).
                                 super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)ppvVar5 >> 3);
          uVar20 = uVar20 + 1) {
        operator_delete(ppvVar5[uVar20]);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
      ::resize(&this->strings_,(long)local_70[-1].strings_before_checkpoint);
      std::vector<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>::resize
                (&this->messages_,(long)pCVar6[-1].messages_before_checkpoint);
      std::
      vector<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
      ::resize(&this->file_tables_,(long)pCVar6[-1].file_tables_before_checkpoint);
      std::vector<void_*,_std::allocator<void_*>_>::resize
                (&this->allocations_,(long)pCVar6[-1].allocations_before_checkpoint);
      ppCVar2 = &(this->checkpoints_).
                 super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppCVar2 = *ppCVar2 + -1;
      return;
    }
    __s1 = ppcVar12[uVar20];
    cVar9 = *__s1;
    if (cVar9 == '\0') {
      uVar8 = 0;
    }
    else {
      uVar8 = 0;
      pcVar10 = __s1;
      do {
        pcVar10 = pcVar10 + 1;
        uVar8 = (long)cVar9 + uVar8 * 5;
        cVar9 = *pcVar10;
      } while (cVar9 != '\0');
    }
    pp_Var16 = (this->symbols_by_name_).
               super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
               .
               super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
               .
               super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
               ._M_buckets +
               uVar8 % (this->symbols_by_name_).
                       super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                       .
                       super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                       .
                       super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                       ._M_bucket_count;
    p_Var3 = *pp_Var16;
    if ((p_Var3 != (_Node *)0x0) && (iVar7 = strcmp(__s1,(p_Var3->_M_v).first), iVar7 != 0)) {
      do {
        p_Var11 = p_Var3;
        p_Var3 = p_Var11->_M_next;
        if (p_Var3 == (_Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
                       *)0x0) break;
        iVar7 = strcmp(__s1,(p_Var3->_M_v).first);
      } while (iVar7 != 0);
      pp_Var16 = &p_Var11->_M_next;
    }
    p_Var18 = *pp_Var16;
    if (p_Var18 ==
        (_Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
         *)0x0) {
      pp_Var14 = (_Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
                  **)0x0;
    }
    else {
      pp_Var14 = (_Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
                  **)0x0;
      do {
        iVar7 = strcmp((((_Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
                          *)(ppcVar12 + uVar20))->_M_v).first,(p_Var18->_M_v).first);
        if (iVar7 != 0) break;
        if (p_Var18 ==
            (_Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
             *)(ppcVar12 + uVar20)) {
          pp_Var17 = &p_Var18->_M_next;
          pp_Var14 = pp_Var16;
        }
        else {
          *pp_Var16 = p_Var18->_M_next;
          operator_delete(p_Var18,0x20);
          psVar1 = &(this->symbols_by_name_).
                    super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                    .
                    super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                    .
                    super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                    ._M_element_count;
          *psVar1 = *psVar1 - 1;
          pp_Var17 = pp_Var16;
        }
        p_Var18 = *pp_Var17;
        pp_Var16 = pp_Var17;
      } while (p_Var18 !=
               (_Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
                *)0x0);
    }
    if (pp_Var14 !=
        (_Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
         **)0x0) {
      p_Var18 = *pp_Var14;
      *pp_Var14 = p_Var18->_M_next;
      operator_delete(p_Var18,0x20);
      psVar1 = &(this->symbols_by_name_).
                super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                .
                super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                .
                super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                ._M_element_count;
      *psVar1 = *psVar1 - 1;
    }
    uVar20 = uVar20 + 1;
    ppcVar12 = (this->symbols_after_checkpoint_).
               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start;
  } while( true );
}

Assistant:

void DescriptorPool::Tables::RollbackToLastCheckpoint() {
  GOOGLE_DCHECK(!checkpoints_.empty());
  const CheckPoint& checkpoint = checkpoints_.back();

  for (int i = checkpoint.pending_symbols_before_checkpoint;
       i < symbols_after_checkpoint_.size();
       i++) {
    symbols_by_name_.erase(symbols_after_checkpoint_[i]);
  }
  for (int i = checkpoint.pending_files_before_checkpoint;
       i < files_after_checkpoint_.size();
       i++) {
    files_by_name_.erase(files_after_checkpoint_[i]);
  }
  for (int i = checkpoint.pending_extensions_before_checkpoint;
       i < extensions_after_checkpoint_.size();
       i++) {
    extensions_.erase(extensions_after_checkpoint_[i]);
  }

  symbols_after_checkpoint_.resize(
      checkpoint.pending_symbols_before_checkpoint);
  files_after_checkpoint_.resize(checkpoint.pending_files_before_checkpoint);
  extensions_after_checkpoint_.resize(
      checkpoint.pending_extensions_before_checkpoint);

  STLDeleteContainerPointers(
      strings_.begin() + checkpoint.strings_before_checkpoint, strings_.end());
  STLDeleteContainerPointers(
      messages_.begin() + checkpoint.messages_before_checkpoint,
      messages_.end());
  STLDeleteContainerPointers(
      file_tables_.begin() + checkpoint.file_tables_before_checkpoint,
      file_tables_.end());
  for (int i = checkpoint.allocations_before_checkpoint;
       i < allocations_.size();
       i++) {
    operator delete(allocations_[i]);
  }

  strings_.resize(checkpoint.strings_before_checkpoint);
  messages_.resize(checkpoint.messages_before_checkpoint);
  file_tables_.resize(checkpoint.file_tables_before_checkpoint);
  allocations_.resize(checkpoint.allocations_before_checkpoint);
  checkpoints_.pop_back();
}